

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O2

IdentPtr __thiscall
HashTbl::PidHashNameLenWithHash<unsigned_char>
          (HashTbl *this,uchar *prgch,uchar *end,int32 cch,uint32 luHash)

{
  code *pcVar1;
  Ident *pIVar2;
  bool bVar3;
  ULONG UVar4;
  undefined4 *puVar5;
  IdentPtr pIVar6;
  LPCUTF8 end_00;
  int cb;
  Ident *local_50;
  uint local_44;
  uchar *puStack_40;
  int32 bucketCount;
  uint local_34 [2];
  int depth;
  
  puStack_40 = end;
  if (cch < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                       ,0x104,"(cch >= 0)","cch >= 0");
    if (!bVar3) goto LAB_00cdef09;
    *puVar5 = 0;
  }
  if (prgch == (uchar *)0x0 && cch != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                       ,0x105,"(cch == 0 || prgch != nullptr)","cch == 0 || prgch != nullptr");
    if (!bVar3) goto LAB_00cdef09;
    *puVar5 = 0;
  }
  end_00 = puStack_40;
  UVar4 = CaseSensitiveComputeHash(prgch,puStack_40);
  if (UVar4 != luHash) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                       ,0x106,"(luHash == CaseSensitiveComputeHash(prgch, end))",
                       "luHash == CaseSensitiveComputeHash(prgch, end)");
    if (!bVar3) {
LAB_00cdef09:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    end_00 = puStack_40;
  }
  local_50 = (Ident *)0x0;
  local_34[0] = 0;
  pIVar6 = FindExistingPid<unsigned_char>
                     (this,prgch,end_00,cch,luHash,(IdentPtr **)&local_50,(int32 *)&local_44,
                      (int *)local_34);
  if (pIVar6 != (IdentPtr)0x0) {
    return pIVar6;
  }
  if ((5 < local_44) && (this->m_luMask < this->m_luCount)) {
    Grow(this);
    pIVar2 = (Ident *)(this->m_prgpidName + (this->m_luMask & luHash));
    do {
      local_50 = pIVar2;
      pIVar2 = local_50->m_pidNext;
    } while (local_50->m_pidNext != (Ident *)0x0);
  }
  local_34[0] = local_34[0] + 1;
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(this->stats,local_34[0]);
  }
  if ((((uint)cch < 0x7fffffeb) && (cb = cch * 2 + 0x2a, -1 < cb)) &&
     (pIVar6 = (IdentPtr)NoReleaseAllocator::Alloc(&this->m_noReleaseAllocator,cb),
     pIVar6 != (IdentPtr)0x0)) {
    local_50->m_pidNext = pIVar6;
    this->m_luCount = this->m_luCount + 1;
    pIVar6->m_pidNext = (Ident *)0x0;
    pIVar6->m_pidRefStack = (PidRefStack *)0x0;
    pIVar6->m_tk = 0x90;
    pIVar6->m_grfid = 0;
    pIVar6->m_luHash = luHash;
    pIVar6->m_cch = cch;
    pIVar6->m_propertyId = -1;
    pIVar6->assignmentState = NotAssigned;
    pIVar6->isUsedInLdElem = false;
    CopyString((LPOLESTR)&pIVar6->field_0x22,prgch,puStack_40);
    return pIVar6;
  }
  OutOfMemory();
}

Assistant:

IdentPtr HashTbl::PidHashNameLenWithHash(_In_reads_(cch) CharType const * prgch, CharType const * end, int32 cch, uint32 luHash)
{
    Assert(cch >= 0);
    Assert(cch == 0 || prgch != nullptr);
    Assert(luHash == CaseSensitiveComputeHash(prgch, end));

    IdentPtr * ppid = nullptr;
    IdentPtr pid;
    LONG cb;
    int32 bucketCount;


#if PROFILE_DICTIONARY
    int depth = 0;
#endif

    pid = this->FindExistingPid(prgch, end, cch, luHash, &ppid, &bucketCount
#if PROFILE_DICTIONARY
                                , depth
#endif
        );
    if (pid)
    {
        return pid;
    }

    if (bucketCount > BucketLengthLimit && m_luCount > m_luMask)
    {
        Grow();

        // ppid is now invalid because the Grow() moves the entries around.
        // Find the correct ppid by repeating the find of the end of the bucket
        // the new item will be placed in.
        // Note this is similar to the main find loop but does not count nor does it
        // look at the entries because we already proved above the entry is not in the
        // table, we just want to find the end of the bucket.
        ppid = &m_prgpidName[luHash & m_luMask];
        while (*ppid)
            ppid = &(*ppid)->m_pidNext;
    }


#if PROFILE_DICTIONARY
    ++depth;
    if (stats)
        stats->Insert(depth);
#endif

    //Windows OS Bug 1795286 : CENTRAL PREFAST RUN: inetcore\scriptengines\src\src\core\hash.cpp :
    //               'sizeof((*pid))+((cch+1))*sizeof(OLECHAR)' may be smaller than
    //               '((cch+1))*sizeof(OLECHAR)'. This can be caused by integer overflows
    //               or underflows. This could yield an incorrect buffer all
    /* Allocate space for the identifier */
    ULONG Len;

    if (FAILED(ULongAdd(cch, 1, &Len)) ||
        FAILED(ULongMult(Len, sizeof(OLECHAR), &Len)) ||
        FAILED(ULongAdd(Len, sizeof(*pid), &Len)) ||
        FAILED(ULongToLong(Len, &cb)))
    {
        cb = 0;
        OutOfMemory();
    }


    if (nullptr == (pid = (IdentPtr)m_noReleaseAllocator.Alloc(cb)))
        OutOfMemory();

    /* Insert the identifier into the hash list */
    *ppid = pid;

    // Increment the number of entries in the table.
    m_luCount++;

    /* Fill in the identifier record */
    pid->m_pidNext = nullptr;
    pid->m_tk = tkLim;
    pid->m_grfid = fidNil;
    pid->m_luHash = luHash;
    pid->m_cch = cch;
    pid->m_pidRefStack = nullptr;
    pid->m_propertyId = Js::Constants::NoProperty;
    pid->assignmentState = NotAssigned;
    pid->isUsedInLdElem = false;

    HashTbl::CopyString(pid->m_sz, prgch, end);

    return pid;
}